

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O1

const_iterator __thiscall
burst::k_ary_search_set<long,_std::less<void>_>::find_impl
          (k_ary_search_set<long,_std::less<void>_> *this,value_type_conflict2 *value)

{
  ulong uVar1;
  long *plVar2;
  pointer plVar3;
  long *plVar4;
  bool bVar5;
  long *plVar6;
  long *plVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  plVar3 = (this->m_values).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  plVar4 = (this->m_values).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar1 = this->m_arity - 1;
  uVar10 = 0;
  do {
    if ((ulong)((long)plVar4 - (long)plVar3 >> 3) <= uVar10) {
      return (const_iterator)plVar4;
    }
    plVar2 = plVar3 + uVar10;
    uVar8 = (long)plVar4 - (long)plVar2 >> 3;
    plVar7 = plVar2;
    uVar9 = uVar8;
    if ((long)uVar1 <= (long)uVar8) {
      uVar8 = uVar1;
      uVar9 = uVar1;
    }
    while (plVar6 = plVar7, 0 < (long)uVar8) {
      uVar11 = uVar8 >> 1;
      uVar8 = ~uVar11 + uVar8;
      plVar7 = plVar6 + uVar11 + 1;
      if (*value <= plVar6[uVar11]) {
        plVar7 = plVar6;
        uVar8 = uVar11;
      }
    }
    if ((plVar6 == plVar2 + uVar9) || (*value < *plVar6)) {
      uVar10 = uVar10 * this->m_arity + (((long)plVar6 - (long)plVar2 >> 3) + 1) * uVar1;
      bVar5 = true;
    }
    else {
      bVar5 = false;
    }
  } while (bVar5);
  return (const_iterator)plVar6;
}

Assistant:

const_iterator find_impl (const value_type & value) const
        {
            std::size_t node_index = 0;

            while (node_index < m_values.size())
            {
                const_iterator node_begin = begin() + static_cast<difference_type>(node_index);
                const_iterator node_end =
                    node_begin +
                    std::min
                    (
                        static_cast<difference_type>(m_arity - 1),
                        std::distance(node_begin, end())
                    );

                const_iterator search_result =
                    std::lower_bound(node_begin, node_end, value, m_compare);
                if (search_result != node_end && not m_compare(value, *search_result))
                {
                    return search_result;
                }
                else
                {
                    node_index = perfect_tree_child_index
                    (
                        m_arity,
                        node_index,
                        static_cast<std::size_t>(std::distance(node_begin, search_result))
                    );
                }
            }

            return end();
        }